

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD SearchPathW(LPCWSTR lpPath,LPCWSTR lpFileName,LPCWSTR lpExtension,DWORD nBufferLength,
                 LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  DWORD DVar1;
  char16_t *__src;
  int iVar2;
  size_t sVar3;
  SIZE_T SVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char16_t *lpFileName_00;
  WCHAR *pWVar8;
  long in_FS_OFFSET;
  char16_t *local_1b8;
  LPCWSTR pNextPath;
  PathWCharString CanonicalPathPS;
  WCHAR *CanonicalPath;
  int iStack_140;
  int canonical_size;
  size_t CanonicalPathLength;
  char *AnsiPath;
  DWORD length;
  DWORD dw;
  size_t FileNameLength;
  size_t PathLength;
  LPCWSTR pPathEnd;
  LPCWSTR pPathStart;
  PathWCharString FullPathPS;
  size_t FullPathLength;
  WCHAR *FullPath;
  DWORD nRet;
  LPWSTR *lpFilePart_local;
  LPWSTR lpBuffer_local;
  DWORD nBufferLength_local;
  LPCWSTR lpExtension_local;
  LPCWSTR lpFileName_local;
  LPCWSTR lpPath_local;
  PathCharString AnsiPathPS;
  
  AnsiPathPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  FullPath._4_4_ = 0;
  FullPathPS.m_count = 0;
  StackString<32UL,_char16_t>::StackString((StackString<32UL,_char16_t> *)&pPathStart);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPath_local);
  StackString<32UL,_char16_t>::StackString((StackString<32UL,_char16_t> *)&pNextPath);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpPath == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x577);
    fprintf(_stderr,"lpPath may not be NULL\n");
    SetLastError(0x57);
  }
  else if (lpFileName == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x57d);
    fprintf(_stderr,"lpFileName may not be NULL\n");
    SetLastError(0x57);
  }
  else if (lpExtension == (LPCWSTR)0x0) {
    if ((*lpFileName == L'\\') || (*lpFileName == L'/')) {
      CanonicalPathPS.m_count =
           (SIZE_T)StackString<32UL,_char16_t>::OpenStringBuffer
                             ((StackString<32UL,_char16_t> *)&pNextPath,0x400);
      if ((char16_t *)CanonicalPathPS.m_count == (char16_t *)0x0) {
        SetLastError(8);
        goto LAB_0039e8df;
      }
      AnsiPath._4_4_ =
           GetFullPathNameW(lpFileName,0x401,(LPWSTR)CanonicalPathPS.m_count,(LPWSTR *)0x0);
      StackString<32UL,_char16_t>::CloseBuffer
                ((StackString<32UL,_char16_t> *)&pNextPath,(ulong)AnsiPath._4_4_);
      if (0x401 < AnsiPath._4_4_) {
        CanonicalPathPS.m_count =
             (SIZE_T)StackString<32UL,_char16_t>::OpenStringBuffer
                               ((StackString<32UL,_char16_t> *)&pNextPath,
                                (ulong)(AnsiPath._4_4_ - 1));
        if ((char16_t *)CanonicalPathPS.m_count == (char16_t *)0x0) {
          SetLastError(8);
          goto LAB_0039e8df;
        }
        AnsiPath._4_4_ =
             GetFullPathNameW(lpFileName,AnsiPath._4_4_,(LPWSTR)CanonicalPathPS.m_count,
                              (LPWSTR *)0x0);
        StackString<32UL,_char16_t>::CloseBuffer
                  ((StackString<32UL,_char16_t> *)&pNextPath,(ulong)AnsiPath._4_4_);
      }
      if (AnsiPath._4_4_ == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        GetLastError();
        SetLastError(0x57);
        goto LAB_0039e8df;
      }
      sVar3 = PAL_wcslen((char16_t *)CanonicalPathPS.m_count);
      SVar4 = (sVar3 + 1) * (long)MaxWCharToAcpLengthRatio;
      pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                         ((StackString<32UL,_char> *)&lpPath_local,SVar4);
      if (pcVar5 == (char *)0x0) {
        SetLastError(8);
        goto LAB_0039e8df;
      }
      iStack_140 = (int)SVar4;
      iVar2 = WideCharToMultiByte(0,0,(LPCWSTR)CanonicalPathPS.m_count,-1,pcVar5,iStack_140,
                                  (LPCSTR)0x0,(LPBOOL)0x0);
      StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPath_local,(long)iVar2);
      iVar2 = access(pcVar5,0);
      if (iVar2 == 0) {
        FullPath._4_4_ = AnsiPath._4_4_;
      }
    }
    else {
      sVar3 = PAL_wcslen(lpFileName);
      local_1b8 = lpPath;
      do {
        while( true ) {
          do {
            while( true ) {
              __src = local_1b8;
              if (*local_1b8 == L'\0') goto LAB_0039e7b1;
              PathLength = (size_t)PAL_wcschr(local_1b8,L':');
              if ((char16_t *)PathLength == (char16_t *)0x0) {
                sVar6 = PAL_wcslen(local_1b8);
                local_1b8 = local_1b8 + sVar6;
                PathLength = (size_t)local_1b8;
              }
              else {
                local_1b8 = (char16_t *)(PathLength + 2);
              }
              lVar7 = (long)(PathLength - (long)__src) >> 1;
              if (lVar7 + sVar3 + 1 < 0x400) break;
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
            }
          } while (lVar7 == 0);
          FullPathPS.m_count = lVar7 + sVar3;
          lpFileName_00 =
               StackString<32UL,_char16_t>::OpenStringBuffer
                         ((StackString<32UL,_char16_t> *)&pPathStart,FullPathPS.m_count + 1);
          if (lpFileName_00 == (char16_t *)0x0) {
            SetLastError(8);
            goto LAB_0039e8df;
          }
          memcpy(lpFileName_00,__src,lVar7 * 2);
          lpFileName_00[lVar7] = L'/';
          PAL_wcscpy(lpFileName_00 + lVar7 + 1,lpFileName);
          StackString<32UL,_char16_t>::CloseBuffer
                    ((StackString<32UL,_char16_t> *)&pPathStart,FullPathPS.m_count + 1);
          CanonicalPathPS.m_count =
               (SIZE_T)StackString<32UL,_char16_t>::OpenStringBuffer
                                 ((StackString<32UL,_char16_t> *)&pNextPath,0x400);
          if ((char16_t *)CanonicalPathPS.m_count == (char16_t *)0x0) {
            SetLastError(8);
            goto LAB_0039e8df;
          }
          AnsiPath._4_4_ =
               GetFullPathNameW(lpFileName_00,0x401,(LPWSTR)CanonicalPathPS.m_count,(LPWSTR *)0x0);
          StackString<32UL,_char16_t>::CloseBuffer
                    ((StackString<32UL,_char16_t> *)&pNextPath,(ulong)AnsiPath._4_4_);
          if (0x401 < AnsiPath._4_4_) {
            CanonicalPathPS.m_count =
                 (SIZE_T)StackString<32UL,_char16_t>::OpenStringBuffer
                                   ((StackString<32UL,_char16_t> *)&pNextPath,
                                    (ulong)(AnsiPath._4_4_ - 1));
            if ((char16_t *)CanonicalPathPS.m_count == (char16_t *)0x0) {
              SetLastError(8);
              goto LAB_0039e8df;
            }
            AnsiPath._4_4_ =
                 GetFullPathNameW(lpFileName_00,AnsiPath._4_4_,(LPWSTR)CanonicalPathPS.m_count,
                                  (LPWSTR *)0x0);
            StackString<32UL,_char16_t>::CloseBuffer
                      ((StackString<32UL,_char16_t> *)&pNextPath,(ulong)AnsiPath._4_4_);
          }
          if (AnsiPath._4_4_ != 0) break;
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          GetLastError();
        }
        sVar6 = PAL_wcslen((char16_t *)CanonicalPathPS.m_count);
        SVar4 = (sVar6 + 1) * (long)MaxWCharToAcpLengthRatio;
        pcVar5 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)&lpPath_local,SVar4);
        if (pcVar5 == (char *)0x0) {
          SetLastError(8);
          goto LAB_0039e8df;
        }
        iStack_140 = (int)SVar4;
        iVar2 = WideCharToMultiByte(0,0,(LPCWSTR)CanonicalPathPS.m_count,-1,pcVar5,iStack_140,
                                    (LPCSTR)0x0,(LPBOOL)0x0);
        StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPath_local,(long)iVar2);
        iVar2 = access(pcVar5,0);
      } while (iVar2 != 0);
      FullPath._4_4_ = AnsiPath._4_4_;
    }
LAB_0039e7b1:
    if (FullPath._4_4_ == 0) {
      SetLastError(2);
    }
    else {
      sVar3 = PAL_wcslen((char16_t *)CanonicalPathPS.m_count);
      DVar1 = (DWORD)sVar3;
      FullPath._4_4_ = DVar1 + 1;
      if (DVar1 + 1 <= nBufferLength) {
        if (lpBuffer == (LPWSTR)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(0x57);
          FullPath._4_4_ = 0;
        }
        else {
          PAL_wcscpy(lpBuffer,(char16_t *)CanonicalPathPS.m_count);
          FullPath._4_4_ = DVar1;
          if (lpFilePart != (LPWSTR *)0x0) {
            pWVar8 = PAL_wcsrchr(lpBuffer,L'/');
            *lpFilePart = pWVar8;
            if (*lpFilePart == (LPWSTR)0x0) {
              fprintf(_stderr,"] %s %s:%d","SearchPathW",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                      ,0x64b);
              fprintf(_stderr,"no \'/\' in full path!\n");
            }
            else {
              *lpFilePart = *lpFilePart + 1;
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x583);
    fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
    SetLastError(0x57);
  }
LAB_0039e8df:
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)&pNextPath);
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPath_local);
  StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)&pPathStart);
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != AnsiPathPS.m_count) {
    __stack_chk_fail();
  }
  return FullPath._4_4_;
}

Assistant:

DWORD
PALAPI
SearchPathW(
    IN LPCWSTR lpPath,
    IN LPCWSTR lpFileName,
    IN LPCWSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPWSTR lpBuffer,
    OUT LPWSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    WCHAR * FullPath;
    size_t FullPathLength = 0;
    PathWCharString FullPathPS;
    LPCWSTR pPathStart;
    LPCWSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD dw;
    DWORD length;
    char * AnsiPath;
    PathCharString AnsiPathPS;
    size_t CanonicalPathLength;
    int canonical_size;
    WCHAR * CanonicalPath;
    PathWCharString CanonicalPathPS;

    PERF_ENTRY(SearchPathW);
    ENTRY("SearchPathW(lpPath=%p (%S), lpFileName=%p (%S), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
	  lpPath,
	  lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameW(lpFileName, length+1, CanonicalPath, NULL);
        CanonicalPathPS.CloseBuffer(dw);
        if (length+1 < dw)
        {
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(lpFileName, dw, CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%S>, error is %#x. failing.\n",
                 lpPath, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
        AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
        if (NULL == AnsiPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
	    canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
			    AnsiPath, CanonicalPathLength, NULL, NULL);
	    AnsiPathPS.CloseBuffer(canonical_size);

        if(0 == access(AnsiPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCWSTR pNextPath;

        pNextPath = lpPath;

        FileNameLength = PAL_wcslen(lpFileName);

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = PAL_wcschr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + PAL_wcslen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*S is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength*sizeof(WCHAR));
            FullPath[PathLength] = '/';
            PAL_wcscpy(&FullPath[PathLength+1], lpFileName);

            FullPathPS.CloseBuffer(FullPathLength+1);

            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(FullPath, length+1,
                                  CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
                if (NULL == CanonicalPath)
                {
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    goto done;
                }
                dw = GetFullPathNameW(FullPath, dw, CanonicalPath, NULL);
                CanonicalPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%S>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
            AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
            if (NULL == AnsiPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
                                AnsiPath, CanonicalPathLength, NULL, NULL);
            AnsiPathPS.CloseBuffer(canonical_size);

            if(0 == access(AnsiPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        /* find out the required buffer size, copy path to buffer if it's
           large enough */
        nRet = PAL_wcslen(CanonicalPath)+1;
        if(nRet <= nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }
            PAL_wcscpy(lpBuffer, CanonicalPath);

            /* don't include the null-terminator in the count if buffer was
               large enough */
            nRet--;

            if(NULL != lpFilePart)
            {
                *lpFilePart = PAL_wcsrchr(lpBuffer, '/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
    }
done:
    LOGEXIT("SearchPathW returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathW);
    return nRet;
}